

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btcp.c
# Opt level: O0

int nn_btcp_create(void *hint,nn_epbase **epbase)

{
  int iVar1;
  nn_fsm *self_00;
  char *__s;
  size_t sVar2;
  nn_ctx *ctx;
  size_t local_f0;
  size_t sz;
  int reconnect_ivl_max;
  int reconnect_ivl;
  size_t ipv4onlylen;
  int ipv4only;
  size_t sslen;
  sockaddr_storage ss;
  char *pos;
  char *end;
  char *addr;
  nn_btcp *self;
  int rc;
  nn_epbase **epbase_local;
  void *hint_local;
  
  self_00 = (nn_fsm *)nn_alloc_(0x3f0);
  if (self_00 == (nn_fsm *)0x0) {
    fprintf(_stderr,"Out of memory (%s:%d)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/tcp/btcp.c"
            ,0x7b);
    fflush(_stderr);
    nn_err_abort();
  }
  nn_epbase_init((nn_epbase *)&self_00[1].shutdown_fn,&nn_btcp_epbase_vfptr,hint);
  __s = nn_epbase_getaddr((nn_epbase *)&self_00[1].shutdown_fn);
  sVar2 = strlen(__s);
  ss.__ss_align = (unsigned_long)strrchr(__s,0x3a);
  if ((char *)ss.__ss_align == (char *)0x0) {
    nn_epbase_term((nn_epbase *)&self_00[1].shutdown_fn);
    hint_local._4_4_ = -0x16;
  }
  else {
    ss.__ss_align = ss.__ss_align + 1;
    iVar1 = nn_port_resolve((char *)ss.__ss_align,(size_t)(__s + (sVar2 - ss.__ss_align)));
    if (iVar1 < 0) {
      nn_epbase_term((nn_epbase *)&self_00[1].shutdown_fn);
      hint_local._4_4_ = -0x16;
    }
    else {
      _reconnect_ivl_max = 4;
      nn_epbase_getopt((nn_epbase *)&self_00[1].shutdown_fn,0,0xe,(void *)((long)&ipv4onlylen + 4),
                       (size_t *)&reconnect_ivl_max);
      if (_reconnect_ivl_max != 4) {
        fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","ipv4onlylen == sizeof (ipv4only)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/tcp/btcp.c"
                ,0x93);
        fflush(_stderr);
        nn_err_abort();
      }
      iVar1 = nn_iface_resolve(__s,(ss.__ss_align - (long)__s) - 1,ipv4onlylen._4_4_,
                               (sockaddr_storage *)&sslen,(size_t *)&stack0xffffffffffffff30);
      if (iVar1 < 0) {
        nn_epbase_term((nn_epbase *)&self_00[1].shutdown_fn);
        hint_local._4_4_ = -0x13;
      }
      else {
        ctx = nn_epbase_getctx((nn_epbase *)&self_00[1].shutdown_fn);
        nn_fsm_init_root(self_00,nn_btcp_handler,nn_btcp_shutdown,ctx);
        *(undefined4 *)&self_00[1].fn = 1;
        local_f0 = 4;
        nn_epbase_getopt((nn_epbase *)&self_00[1].shutdown_fn,0,6,(void *)((long)&sz + 4),&local_f0)
        ;
        if (local_f0 != 4) {
          fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","sz == sizeof (reconnect_ivl)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/tcp/btcp.c"
                  ,0xa3);
          fflush(_stderr);
          nn_err_abort();
        }
        local_f0 = 4;
        nn_epbase_getopt((nn_epbase *)&self_00[1].shutdown_fn,0,7,&sz,&local_f0);
        if (local_f0 != 4) {
          fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","sz == sizeof (reconnect_ivl_max)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/tcp/btcp.c"
                  ,0xa7);
          fflush(_stderr);
          nn_err_abort();
        }
        if ((int)sz == 0) {
          sz._0_4_ = sz._4_4_;
        }
        nn_backoff_init((nn_backoff *)&self_00[8].stopped.src,3,sz._4_4_,(int)sz,self_00);
        nn_usock_init((nn_usock *)&self_00[1].srcptr,1,self_00);
        self_00[8].owner = (nn_fsm *)0x0;
        nn_list_init((nn_list *)&self_00[8].ctx);
        nn_fsm_start(self_00);
        *epbase = (nn_epbase *)&self_00[1].shutdown_fn;
        hint_local._4_4_ = 0;
      }
    }
  }
  return hint_local._4_4_;
}

Assistant:

int nn_btcp_create (void *hint, struct nn_epbase **epbase)
{
    int rc;
    struct nn_btcp *self;
    const char *addr;
    const char *end;
    const char *pos;
    struct sockaddr_storage ss;
    size_t sslen;
    int ipv4only;
    size_t ipv4onlylen;
    int reconnect_ivl;
    int reconnect_ivl_max;
    size_t sz;

    /*  Allocate the new endpoint object. */
    self = nn_alloc (sizeof (struct nn_btcp), "btcp");
    alloc_assert (self);

    /*  Initalise the epbase. */
    nn_epbase_init (&self->epbase, &nn_btcp_epbase_vfptr, hint);
    addr = nn_epbase_getaddr (&self->epbase);

    /*  Parse the port. */
    end = addr + strlen (addr);
    pos = strrchr (addr, ':');
    if (nn_slow (!pos)) {
        nn_epbase_term (&self->epbase);
        return -EINVAL;
    }
    ++pos;
    rc = nn_port_resolve (pos, end - pos);
    if (nn_slow (rc < 0)) {
        nn_epbase_term (&self->epbase);
        return -EINVAL;
    }

    /*  Check whether IPv6 is to be used. */
    ipv4onlylen = sizeof (ipv4only);
    nn_epbase_getopt (&self->epbase, NN_SOL_SOCKET, NN_IPV4ONLY,
        &ipv4only, &ipv4onlylen);
    nn_assert (ipv4onlylen == sizeof (ipv4only));

    /*  Parse the address. */
    rc = nn_iface_resolve (addr, pos - addr - 1, ipv4only, &ss, &sslen);
    if (nn_slow (rc < 0)) {
        nn_epbase_term (&self->epbase);
        return -ENODEV;
    }

    /*  Initialise the structure. */
    nn_fsm_init_root (&self->fsm, nn_btcp_handler, nn_btcp_shutdown,
        nn_epbase_getctx (&self->epbase));
    self->state = NN_BTCP_STATE_IDLE;
    sz = sizeof (reconnect_ivl);
    nn_epbase_getopt (&self->epbase, NN_SOL_SOCKET, NN_RECONNECT_IVL,
        &reconnect_ivl, &sz);
    nn_assert (sz == sizeof (reconnect_ivl));
    sz = sizeof (reconnect_ivl_max);
    nn_epbase_getopt (&self->epbase, NN_SOL_SOCKET, NN_RECONNECT_IVL_MAX,
        &reconnect_ivl_max, &sz);
    nn_assert (sz == sizeof (reconnect_ivl_max));
    if (reconnect_ivl_max == 0)
        reconnect_ivl_max = reconnect_ivl;
    nn_backoff_init (&self->retry, NN_BTCP_SRC_RECONNECT_TIMER,
        reconnect_ivl, reconnect_ivl_max, &self->fsm);
    nn_usock_init (&self->usock, NN_BTCP_SRC_USOCK, &self->fsm);
    self->atcp = NULL;
    nn_list_init (&self->atcps);

    /*  Start the state machine. */
    nn_fsm_start (&self->fsm);

    /*  Return the base class as an out parameter. */
    *epbase = &self->epbase;

    return 0;
}